

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O3

void __thiscall
xray_re::_lzhuf::Encode
          (_lzhuf *this,uint8_t **_code,size_t *_codesize,uint8_t *_text,size_t _textsize)

{
  uchar *puVar1;
  uint8_t uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  long lVar5;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *__stream;
  FILE *extraout_RDX_01;
  FILE *extraout_RDX_02;
  FILE *extraout_RDX_03;
  int iVar6;
  int iVar7;
  uint r;
  uint p;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  this->m_src_limit = _textsize;
  this->m_src_pos = 0;
  this->m_src = _text;
  this->m_dest_limit = _textsize >> 1;
  this->m_dest_pos = 4;
  puVar4 = (uint8_t *)malloc(_textsize >> 1);
  this->m_dest = puVar4;
  *(int *)puVar4 = (int)_textsize;
  this->putbuf = 0;
  this->putlen = '\0';
  StartHuff(this);
  lVar5 = 0x2413;
  do {
    puVar1 = this->text_buf + lVar5 * 4;
    puVar1[0] = '\0';
    puVar1[1] = '\x10';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\x10';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\x10';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\x10';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x2513);
  lVar5 = 0x2513;
  do {
    puVar1 = this->text_buf + lVar5 * 4;
    puVar1[0] = '\0';
    puVar1[1] = '\x10';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\x10';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\x10';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\x10';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x3513);
  memset(this,0x20,0xfc4);
  uVar10 = 0;
  do {
    uVar3 = this->m_src_pos;
    if (this->m_src_limit <= uVar3) goto LAB_001704af;
    this->m_src_pos = uVar3 + 1;
    *(uint8_t *)((long)this->lson + (uVar10 - 0x80)) = this->m_src[uVar3];
    uVar10 = uVar10 + 1;
  } while (uVar10 != 0x3c);
  uVar10 = 0x3c;
LAB_001704af:
  this->textsize = uVar10 & 0xffffffff;
  iVar7 = 0xfc3;
  do {
    InsertNode(this,iVar7);
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0xf87);
  r = 0xfc4;
  InsertNode(this,0xfc4);
  p = 0;
  do {
    iVar9 = (int)uVar10;
    iVar7 = this->match_length;
    if (iVar9 < this->match_length) {
      this->match_length = iVar9;
      iVar7 = iVar9;
    }
    if (iVar7 < 3) {
      this->match_length = 1;
      EncodeChar(this,(uint)this->text_buf[(int)r]);
      __stream = extraout_RDX;
    }
    else {
      EncodeChar(this,iVar7 + 0xfd);
      EncodePosition(this,this->match_position);
      __stream = extraout_RDX_00;
    }
    iVar7 = this->match_length;
    if (iVar7 < 1) {
      iVar8 = 0;
LAB_001705c2:
      if (iVar8 < iVar7) {
        iVar6 = 0;
        do {
          DeleteNode(this,p);
          r = r + 1 & 0xfff;
          __stream = extraout_RDX_02;
          if (iVar9 + -1 != iVar6) {
            InsertNode(this,r);
            __stream = extraout_RDX_03;
          }
          p = p + 1 & 0xfff;
          iVar6 = iVar6 + 1;
        } while (iVar7 - iVar8 != iVar6);
        uVar10 = (ulong)(uint)((iVar8 + iVar9) - iVar7);
      }
    }
    else {
      iVar8 = 0;
      do {
        uVar3 = this->m_src_pos;
        if (this->m_src_limit <= uVar3) goto LAB_001705c2;
        this->m_src_pos = uVar3 + 1;
        uVar2 = this->m_src[uVar3];
        DeleteNode(this,p);
        this->text_buf[(int)p] = uVar2;
        if (p < 0x3b) {
          *(uint8_t *)((long)this->lson + (long)(int)p + -0x44) = uVar2;
        }
        p = p + 1 & 0xfff;
        r = r + 1 & 0xfff;
        InsertNode(this,r);
        iVar8 = iVar8 + 1;
        __stream = extraout_RDX_01;
      } while (iVar7 != iVar8);
    }
    if ((int)uVar10 < 1) {
      if (this->putlen != '\0') {
        putc(this,this->putbuf >> 8,__stream);
        this->codesize = this->codesize + 1;
      }
      *_code = this->m_dest;
      *_codesize = this->m_dest_pos;
      return;
    }
  } while( true );
}

Assistant:

void _lzhuf::Encode(uint8_t*& _code, size_t& _codesize, const uint8_t* _text, size_t _textsize)  /* compression */
{
	int i, c, len, r, s, last_match_length;

	m_src_limit = _textsize;
	m_src_pos = 0;
	m_src = _text;

	m_dest_limit = _textsize/2;
	m_dest_pos = 4;
	m_dest = static_cast<uint8_t*>(malloc(m_dest_limit));
	*(uint32_t*)m_dest = uint32_t(_textsize);

	putbuf = 0;
	putlen = 0;

	StartHuff();
	InitTree();
	s = 0;
	r = N - F;
	for (i = s; i < r; i++)
		text_buf[i] = ' ';
	for (len = 0; len < F && (c = getc()) >= 0; len++)
		text_buf[r + len] = c;
	textsize = len;
	for (i = 1; i <= F; i++)
		InsertNode(r - i);
	InsertNode(r);
	do {
		if (match_length > len)
			match_length = len;
		if (match_length <= THRESHOLD) {
			match_length = 1;
			EncodeChar(text_buf[r]);
		} else {
			EncodeChar(255 - THRESHOLD + match_length);
			EncodePosition(match_position);
		}
		last_match_length = match_length;
		for (i = 0; i < last_match_length && (c = getc()) >= 0; i++) {
			DeleteNode(s);
			text_buf[s] = c;
			if (s < F - 1)
				text_buf[s + N] = c;
			s = (s + 1) & (N - 1);
			r = (r + 1) & (N - 1);
			InsertNode(r);
		}
		while (i++ < last_match_length) {
			DeleteNode(s);
			s = (s + 1) & (N - 1);
			r = (r + 1) & (N - 1);
			if (--len) InsertNode(r);
		}
	} while (len > 0);
	EncodeEnd();
	_code = m_dest;
	_codesize = m_dest_pos;
}